

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

gdImagePtr gdImageClone(gdImagePtr src)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  gdImagePtr im;
  long lVar7;
  gdImagePtr pgVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  
  if (src->trueColor == 0) {
    im = gdImageCreate(src->sx,src->sy);
  }
  else {
    im = gdImageCreateTrueColor(src->sx,src->sy);
  }
  if (im != (gdImagePtr)0x0) {
    if (src->trueColor == 0) {
      im->colorsTotal = src->colorsTotal;
      lVar7 = 0x614;
      do {
        *(undefined4 *)((long)im + lVar7 * 4 + -0x183c) =
             *(undefined4 *)((long)src + lVar7 * 4 + -0x183c);
        *(undefined4 *)((long)im + lVar7 * 4 + -0x143c) =
             *(undefined4 *)((long)src + lVar7 * 4 + -0x143c);
        *(undefined4 *)((long)im + lVar7 * 4 + -0x103c) =
             *(undefined4 *)((long)src + lVar7 * 4 + -0x103c);
        im->red[lVar7 + -5] = src->red[lVar7 + -5];
        *(undefined4 *)((long)im + lVar7 * 4 + -0xc3c) =
             *(undefined4 *)((long)src + lVar7 * 4 + -0xc3c);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x714);
      iVar10 = src->sy;
      if (0 < iVar10) {
        uVar9 = (ulong)(uint)src->sx;
        lVar7 = 0;
        do {
          if (0 < (int)uVar9) {
            lVar11 = 0;
            do {
              im->pixels[lVar7][lVar11] = src->pixels[lVar7][lVar11];
              lVar11 = lVar11 + 1;
              uVar9 = (ulong)src->sx;
            } while (lVar11 < (long)uVar9);
            iVar10 = src->sy;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < iVar10);
      }
    }
    else {
      iVar10 = src->sy;
      if (0 < iVar10) {
        uVar9 = (ulong)(uint)src->sx;
        lVar7 = 0;
        do {
          if (0 < (int)uVar9) {
            piVar1 = src->tpixels[lVar7];
            piVar2 = im->tpixels[lVar7];
            lVar11 = 0;
            do {
              piVar2[lVar11] = piVar1[lVar11];
              lVar11 = lVar11 + 1;
              uVar9 = (ulong)src->sx;
            } while (lVar11 < (long)uVar9);
            iVar10 = src->sy;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < iVar10);
      }
    }
    if (0 < src->styleLength) {
      im->styleLength = src->styleLength;
      im->stylePos = src->stylePos;
      if (0 < src->styleLength) {
        piVar1 = src->style;
        piVar2 = im->style;
        lVar7 = 0;
        do {
          piVar2[lVar7] = piVar1[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 < src->styleLength);
      }
    }
    im->interlace = src->interlace;
    iVar10 = src->saveAlphaFlag;
    iVar3 = src->AA;
    iVar4 = src->AA_color;
    im->alphaBlendingFlag = src->alphaBlendingFlag;
    im->saveAlphaFlag = iVar10;
    im->AA = iVar3;
    im->AA_color = iVar4;
    iVar10 = src->cx1;
    iVar3 = src->cy1;
    iVar4 = src->cx2;
    im->AA_dont_blend = src->AA_dont_blend;
    im->cx1 = iVar10;
    im->cy1 = iVar3;
    im->cx2 = iVar4;
    uVar5 = src->res_x;
    uVar6 = src->res_y;
    iVar10 = src->paletteQuantizationMethod;
    im->cy2 = src->cy2;
    im->res_x = uVar5;
    im->res_y = uVar6;
    im->paletteQuantizationMethod = iVar10;
    iVar10 = src->paletteQuantizationMinQuality;
    im->paletteQuantizationSpeed = src->paletteQuantizationSpeed;
    im->paletteQuantizationMinQuality = iVar10;
    im->interpolation_id = src->interpolation_id;
    im->interpolation = src->interpolation;
    if (src->brush != (gdImagePtr)0x0) {
      pgVar8 = gdImageClone(src->brush);
      im->brush = pgVar8;
    }
    if (src->tile != (gdImagePtr)0x0) {
      pgVar8 = gdImageClone(src->tile);
      im->tile = pgVar8;
    }
    if (src->style != (int *)0x0) {
      gdImageSetStyle(im,src->style,src->styleLength);
    }
    lVar7 = -0x100;
    do {
      im->tileColorMap[lVar7] = src->tileColorMap[lVar7];
      im->alpha[lVar7 + -6] = src->alpha[lVar7 + -6];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0);
    if ((0 < src->polyAllocated) && (im->polyAllocated = src->polyAllocated, 0 < src->polyAllocated)
       ) {
      piVar1 = src->polyInts;
      piVar2 = im->polyInts;
      lVar7 = 0;
      do {
        piVar2[lVar7] = piVar1[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 < src->polyAllocated);
    }
  }
  return im;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageClone (gdImagePtr src) {
	gdImagePtr dst;
	register int i, x;

	if (src->trueColor) {
		dst = gdImageCreateTrueColor(src->sx , src->sy);
	} else {
		dst = gdImageCreate(src->sx , src->sy);
	}

	if (dst == NULL) {
		return NULL;
	}

	if (src->trueColor == 0) {
		dst->colorsTotal = src->colorsTotal;
		for (i = 0; i < gdMaxColors; i++) {
			dst->red[i]   = src->red[i];
			dst->green[i] = src->green[i];
			dst->blue[i]  = src->blue[i];
			dst->alpha[i] = src->alpha[i];
			dst->open[i]  = src->open[i];
		}
		for (i = 0; i < src->sy; i++) {
			for (x = 0; x < src->sx; x++) {
				dst->pixels[i][x] = src->pixels[i][x];
			}
		}
	} else {
		for (i = 0; i < src->sy; i++) {
			for (x = 0; x < src->sx; x++) {
				dst->tpixels[i][x] = src->tpixels[i][x];
			}
		}
	}

	if (src->styleLength > 0) {
		dst->styleLength = src->styleLength;
		dst->stylePos    = src->stylePos;
		for (i = 0; i < src->styleLength; i++) {
			dst->style[i] = src->style[i];
		}
	}

	dst->interlace   = src->interlace;

	dst->alphaBlendingFlag = src->alphaBlendingFlag;
	dst->saveAlphaFlag     = src->saveAlphaFlag;
	dst->AA                = src->AA;
	dst->AA_color          = src->AA_color;
	dst->AA_dont_blend     = src->AA_dont_blend;

	dst->cx1 = src->cx1;
	dst->cy1 = src->cy1;
	dst->cx2 = src->cx2;
	dst->cy2 = src->cy2;

	dst->res_x = src->res_x;
	dst->res_y = src->res_y;

	dst->paletteQuantizationMethod     = src->paletteQuantizationMethod;
	dst->paletteQuantizationSpeed      = src->paletteQuantizationSpeed;
	dst->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;
	dst->paletteQuantizationMinQuality = src->paletteQuantizationMinQuality;

	dst->interpolation_id = src->interpolation_id;
	dst->interpolation    = src->interpolation;

	if (src->brush) {
		dst->brush = gdImageClone(src->brush);
	}

	if (src->tile) {
		dst->tile = gdImageClone(src->tile);
	}

	if (src->style) {
		gdImageSetStyle(dst, src->style, src->styleLength);
	}

	for (i = 0; i < gdMaxColors; i++) {
		dst->brushColorMap[i] = src->brushColorMap[i];
		dst->tileColorMap[i] = src->tileColorMap[i];
	}

	if (src->polyAllocated > 0) {
		dst->polyAllocated = src->polyAllocated;
		for (i = 0; i < src->polyAllocated; i++) {
			dst->polyInts[i] = src->polyInts[i];
		}
	}

	return dst;
}